

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O0

void __thiscall helics::apps::BrokerServer::BrokerServer(BrokerServer *this)

{
  unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  size_type in_stack_000013b8;
  bool in_stack_ffffffffffffffef;
  
  *(__int_type *)
   &(in_RDI->_M_t).
    super___uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
    ._M_t.
    super__Tuple_impl<0UL,_helics::fileops::JsonStorage_*,_std::default_delete<helics::fileops::JsonStorage>_>
    .super__Head_base<0UL,_helics::fileops::JsonStorage_*,_false>._M_head_impl = true;
  *(undefined1 *)
   ((long)&(in_RDI->_M_t).
           super___uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::fileops::JsonStorage_*,_std::default_delete<helics::fileops::JsonStorage>_>
           .super__Head_base<0UL,_helics::fileops::JsonStorage_*,_false>._M_head_impl + 1) = 0;
  *(undefined1 *)
   ((long)&(in_RDI->_M_t).
           super___uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::fileops::JsonStorage_*,_std::default_delete<helics::fileops::JsonStorage>_>
           .super__Head_base<0UL,_helics::fileops::JsonStorage_*,_false>._M_head_impl + 2) = 0;
  *(undefined1 *)
   ((long)&(in_RDI->_M_t).
           super___uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::fileops::JsonStorage_*,_std::default_delete<helics::fileops::JsonStorage>_>
           .super__Head_base<0UL,_helics::fileops::JsonStorage_*,_false>._M_head_impl + 3) = 0;
  *(undefined1 *)
   ((long)&(in_RDI->_M_t).
           super___uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::fileops::JsonStorage_*,_std::default_delete<helics::fileops::JsonStorage>_>
           .super__Head_base<0UL,_helics::fileops::JsonStorage_*,_false>._M_head_impl + 4) = 0;
  *(undefined1 *)
   ((long)&(in_RDI->_M_t).
           super___uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::fileops::JsonStorage_*,_std::default_delete<helics::fileops::JsonStorage>_>
           .super__Head_base<0UL,_helics::fileops::JsonStorage_*,_false>._M_head_impl + 5) = 0;
  CLI::std::atomic<bool>::atomic((atomic<bool> *)in_RDI,in_stack_ffffffffffffffef);
  CLI::std::
  vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ::vector((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
            *)0x1e6053);
  std::__cxx11::string::string(unaff_retaddr);
  gmlc::utilities::randomString_abi_cxx11_(in_stack_000013b8);
  std::unique_ptr<helics::fileops::JsonStorage,std::default_delete<helics::fileops::JsonStorage>>::
  unique_ptr<std::default_delete<helics::fileops::JsonStorage>,void>(in_RDI);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  return;
}

Assistant:

BrokerServer::BrokerServer() noexcept:
    zmq_server{true}, server_name_{gmlc::utilities::randomString(5)}
{
}